

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O2

void __thiscall
QHttpNetworkConnectionPrivate::QHttpNetworkConnectionPrivate
          (QHttpNetworkConnectionPrivate *this,quint16 connectionCount,QString *hostName,
          quint16 port,bool encrypt,bool isLocalSocket,ConnectionType type)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  int iVar6;
  undefined6 in_register_00000032;
  long lVar7;
  ulong uVar8;
  QHttpNetworkConnectionChannel *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  iVar6 = (int)CONCAT62(in_register_00000032,connectionCount);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,QObjectPrivateVersion);
  *(undefined ***)this = &PTR__QHttpNetworkConnectionPrivate_002cd440;
  this->state = RunningState;
  this->networkLayerState = Unknown;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->hostName).d,&hostName->d);
  this->port = port;
  this->encrypt = encrypt;
  this->isLocalSocket = isLocalSocket;
  iVar2 = 1;
  if (1 < type - ConnectionTypeHTTP2) {
    iVar2 = iVar6;
  }
  this->delayIpv4 = true;
  this->activeChannelCount = iVar2;
  this->channelCount = iVar6;
  QTimer::QTimer(&this->delayedConnectionTimer,(QObject *)0x0);
  uVar8 = (ulong)this->channelCount;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar8;
  uVar3 = SUB168(auVar1 * ZEXT816(0x108),0);
  uVar4 = uVar3 + 8;
  if (0xfffffffffffffff7 < uVar3) {
    uVar4 = 0xffffffffffffffff;
  }
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x108),8) == 0) {
    uVar3 = uVar4;
  }
  puVar5 = (ulong *)operator_new__(uVar3);
  *puVar5 = uVar8;
  if (uVar8 != 0) {
    lVar7 = uVar8 * 0x108;
    this_00 = (QHttpNetworkConnectionChannel *)(puVar5 + 1);
    do {
      QHttpNetworkConnectionChannel::QHttpNetworkConnectionChannel
                ((QHttpNetworkConnectionChannel *)this_00);
      this_00 = this_00 + 1;
      lVar7 = lVar7 + -0x108;
    } while (lVar7 != 0);
  }
  this->channels = (QHttpNetworkConnectionChannel *)(puVar5 + 1);
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  local_78.size = 0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_98.size = 0;
  QNetworkProxy::QNetworkProxy
            (&this->networkProxy,NoProxy,(QString *)&local_58,0,(QString *)&local_78,
             (QString *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  (this->lowPriorityQueue).d.ptr = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x0;
  (this->lowPriorityQueue).d.size = 0;
  (this->highPriorityQueue).d.size = 0;
  (this->lowPriorityQueue).d.d = (Data *)0x0;
  this->preConnectRequests = 0;
  (this->highPriorityQueue).d.d = (Data *)0x0;
  (this->highPriorityQueue).d.ptr = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x0;
  this->connectionType = type;
  (this->sslContext).super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->sslContext).super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QHttp2Configuration::QHttp2Configuration(&this->http2Parameters);
  (this->peerVerifyName).d.d = (Data *)0x0;
  (this->peerVerifyName).d.ptr = (char16_t *)0x0;
  (this->peerVerifyName).d.size = 0;
  QNetworkConnectionMonitor::QNetworkConnectionMonitor(&this->connectionMonitor);
  if (isLocalSocket) {
    this->networkLayerState = IPv4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHttpNetworkConnectionPrivate::QHttpNetworkConnectionPrivate(
        quint16 connectionCount, const QString &hostName, quint16 port, bool encrypt,
        bool isLocalSocket, QHttpNetworkConnection::ConnectionType type)
    : hostName(hostName),
      port(port),
      encrypt(encrypt),
      isLocalSocket(isLocalSocket),
      activeChannelCount(getPreferredActiveChannelCount(type, connectionCount)),
      channelCount(connectionCount),
      channels(new QHttpNetworkConnectionChannel[channelCount]),
#ifndef QT_NO_NETWORKPROXY
      networkProxy(QNetworkProxy::NoProxy),
#endif
      connectionType(type)
{
    if (isLocalSocket) // Don't try to do host lookup for local sockets
        networkLayerState = IPv4;
    // We allocate all 6 channels even if it's an HTTP/2-enabled
    // connection: in case the protocol negotiation via NPN/ALPN fails,
    // we will have normally working HTTP/1.1.
    Q_ASSERT(channelCount >= activeChannelCount);
}